

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_script.c
# Opt level: O2

void ngx_stream_script_copy_code(ngx_stream_script_engine_t *e)

{
  u_char *__dest;
  ngx_log_t *log;
  long lVar1;
  u_char *puVar2;
  u_char *puVar3;
  
  puVar3 = e->ip;
  __dest = e->pos;
  if ((e->field_0x38 & 2) == 0) {
    memcpy(__dest,puVar3 + 0x10,*(size_t *)(puVar3 + 8));
    lVar1 = *(long *)(puVar3 + 8);
    e->pos = __dest + lVar1;
    puVar3 = e->ip;
    puVar2 = __dest + lVar1;
  }
  else {
    lVar1 = *(long *)(puVar3 + 8);
    puVar2 = __dest;
  }
  e->ip = puVar3 + (lVar1 + 7U & 0xfffffffffffffff8) + 0x10;
  log = e->session->connection->log;
  if ((log->log_level & 0x400) == 0) {
    return;
  }
  ngx_log_error_core(8,log,0,"stream script copy: \"%*s\"",(long)puVar2 - (long)__dest,__dest);
  return;
}

Assistant:

void
ngx_stream_script_copy_code(ngx_stream_script_engine_t *e)
{
    u_char                         *p;
    ngx_stream_script_copy_code_t  *code;

    code = (ngx_stream_script_copy_code_t *) e->ip;

    p = e->pos;

    if (!e->skip) {
        e->pos = ngx_copy(p, e->ip + sizeof(ngx_stream_script_copy_code_t),
                          code->len);
    }

    e->ip += sizeof(ngx_stream_script_copy_code_t)
          + ((code->len + sizeof(uintptr_t) - 1) & ~(sizeof(uintptr_t) - 1));

    ngx_log_debug2(NGX_LOG_DEBUG_STREAM, e->session->connection->log, 0,
                   "stream script copy: \"%*s\"", e->pos - p, p);
}